

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int compression_end_ppmd(archive *a,la_zstream *lastrm)

{
  CPpmd7 *in_RSI;
  ppmd_stream *strm;
  ISzAlloc *alloc;
  
  alloc = (ISzAlloc *)in_RSI->LoUnit;
  Ppmd7_Free(in_RSI,alloc);
  free(alloc[0x4b2].Free);
  free(alloc);
  in_RSI->LoUnit = (Byte *)0x0;
  *(undefined4 *)&in_RSI->Base = 0;
  return 0;
}

Assistant:

static int
compression_end_ppmd(struct archive *a, struct la_zstream *lastrm)
{
	struct ppmd_stream *strm;

	(void)a; /* UNUSED */

	strm = (struct ppmd_stream *)lastrm->real_stream;
	__archive_ppmd7_functions.Ppmd7_Free(&strm->ppmd7_context, &g_szalloc);
	free(strm->buff);
	free(strm);
	lastrm->real_stream = NULL;
	lastrm->valid = 0;
	return (ARCHIVE_OK);
}